

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexInt_Test::TestBody(LexerTest_LexInt_Test *this)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  byte extraout_DL_03;
  byte extraout_DL_04;
  byte extraout_DL_05;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  byte extraout_DL_09;
  byte extraout_DL_10;
  byte extraout_DL_11;
  undefined1 extraout_DL_12;
  byte extraout_DL_13;
  byte extraout_DL_14;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  string_view buffer_37;
  string_view buffer_38;
  string_view buffer_39;
  string_view buffer_40;
  string_view buffer_41;
  string_view buffer_42;
  string_view buffer_43;
  string_view buffer_44;
  string_view buffer_45;
  string_view buffer_46;
  string_view buffer_47;
  string_view buffer_48;
  string_view buffer_49;
  string_view buffer_50;
  string_view buffer_51;
  string_view buffer_52;
  string_view buffer_53;
  string_view buffer_54;
  string_view buffer_55;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_980;
  bool local_960;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_958;
  bool local_938;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_930;
  bool local_910;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_908;
  bool local_8e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_8e0;
  bool local_8c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_8b8;
  bool local_898;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_890;
  bool local_870;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_868;
  bool local_848;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_840;
  bool local_820;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_818;
  bool local_7f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7f0;
  bool local_7d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7c8;
  bool local_7a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7a0;
  bool local_780;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_778;
  bool local_758;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_750;
  bool local_730;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_728;
  bool local_708;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_700;
  bool local_6e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6d8;
  bool local_6b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6b0;
  bool local_690;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_688;
  bool local_668;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_660;
  bool local_640;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_638;
  bool local_618;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_610;
  bool local_5f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5e8;
  bool local_5c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5c0;
  bool local_5a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_598;
  bool local_578;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_570;
  bool local_550;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_548;
  bool local_528;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_520;
  bool local_500;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4f8;
  bool local_4d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4d0;
  bool local_4b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4a8;
  bool local_488;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_480;
  bool local_460;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_458;
  bool local_438;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_430;
  bool local_410;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_408;
  bool local_3e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3e0;
  bool local_3c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3b8;
  bool local_398;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_390;
  bool local_370;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_368;
  bool local_348;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_340;
  bool local_320;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_318;
  bool local_2f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2f0;
  bool local_2d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2c8;
  bool local_2a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2a0;
  bool local_280;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_278;
  bool local_258;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_250;
  bool local_230;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_228;
  bool local_208;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_200;
  bool local_1e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1d8;
  bool local_1b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b0;
  bool local_190;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_188;
  bool local_168;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_160;
  bool local_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_138;
  bool local_118;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_110;
  bool local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c0;
  bool local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  bool local_58;
  AssertHelper local_40;
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  local_960 = false;
  buffer._M_str = "0";
  buffer._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_980);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_ = local_40.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"0\"sv).takeU8()","uint8_t(0)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_960 == true) {
    local_960 = false;
    if (local_980._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_980._M_value + 0x10)) {
      operator_delete((void *)local_980._M_value._M_dataplus._M_p,local_980._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x62,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_938 = false;
  buffer_00._M_str = "0";
  buffer_00._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_00,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_958);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_ = local_40.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_938 == true) {
    local_938 = false;
    if (local_958._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_958._M_value + 0x10)) {
      operator_delete((void *)local_958._M_value._M_dataplus._M_p,local_958._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_910 = false;
  buffer_01._M_str = "0";
  buffer_01._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_01,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_930);
  uVar2 = ::wasm::WATParser::Lexer::takeI<unsigned_short>();
  local_38._M_value._0_4_ = uVar2;
  local_40.data_ = local_40.data_ & 0xffffffffffff0000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_short>,unsigned_short>
            (local_28,"Lexer(\"0\"sv).takeI16()","uint16_t(0)",(optional<unsigned_short> *)&local_38
             ,(unsigned_short *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_910 == true) {
    local_910 = false;
    if (local_930._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_930._M_value + 0x10)) {
      operator_delete((void *)local_930._M_value._M_dataplus._M_p,local_930._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_8e8 = false;
  buffer_02._M_str = "0";
  buffer_02._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_02,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_908);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"0\"sv).takeU32()","uint32_t(0)",(optional<unsigned_int> *)&local_38,
             (uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_8e8 == true) {
    local_8e8 = false;
    if (local_908._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_908._M_value + 0x10)) {
      operator_delete((void *)local_908._M_value._M_dataplus._M_p,local_908._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_8c0 = false;
  buffer_03._M_str = "0";
  buffer_03._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_03,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_8e0);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_ = local_40.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"0\"sv).takeI32()","uint32_t(0)",(optional<unsigned_int> *)&local_38,
             (uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_8c0 == true) {
    local_8c0 = false;
    if (local_8e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_8e0._M_value + 0x10)) {
      operator_delete((void *)local_8e0._M_value._M_dataplus._M_p,local_8e0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_898 = false;
  buffer_04._M_str = "0";
  buffer_04._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_04,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_8b8);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_40.data_ = (AssertHelperData *)0x0;
  local_30 = extraout_DL;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"0\"sv).takeU64()","uint64_t(0)",(optional<unsigned_long> *)&local_38,
             (unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_898 == true) {
    local_898 = false;
    if (local_8b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_8b8._M_value + 0x10)) {
      operator_delete((void *)local_8b8._M_value._M_dataplus._M_p,local_8b8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_870 = false;
  buffer_05._M_str = "0";
  buffer_05._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_05,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_890);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_40.data_ = (AssertHelperData *)0x0;
  local_30 = extraout_DL_00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"0\"sv).takeI64()","uint64_t(0)",(optional<unsigned_long> *)&local_38,
             (unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_870 == true) {
    local_870 = false;
    if (local_890._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_890._M_value + 0x10)) {
      operator_delete((void *)local_890._M_value._M_dataplus._M_p,local_890._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x68,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_848 = false;
  buffer_06._M_str = "+0";
  buffer_06._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_06,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_868);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_848 == true) {
    local_848 = false;
    if (local_868._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_868._M_value + 0x10)) {
      operator_delete((void *)local_868._M_value._M_dataplus._M_p,local_868._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"+0\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6a,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_820 = false;
  buffer_07._M_str = "+0";
  buffer_07._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_07,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_840);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_ = local_40.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"+0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_820 == true) {
    local_820 = false;
    if (local_840._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_840._M_value + 0x10)) {
      operator_delete((void *)local_840._M_value._M_dataplus._M_p,local_840._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_7f8 = false;
  buffer_08._M_str = "-0";
  buffer_08._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_08,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_818);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_7f8 == true) {
    local_7f8 = false;
    if (local_818._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_818._M_value + 0x10)) {
      operator_delete((void *)local_818._M_value._M_dataplus._M_p,local_818._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"-0\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_7d0 = false;
  buffer_09._M_str = "-0";
  buffer_09._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_09,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7f0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_ = local_40.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"-0\"sv).takeI8()","uint8_t(0)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_7d0 == true) {
    local_7d0 = false;
    if (local_7f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7f0._M_value + 0x10)) {
      operator_delete((void *)local_7f0._M_value._M_dataplus._M_p,local_7f0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_7a8 = false;
  buffer_10._M_str = "1";
  buffer_10._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_10,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7c8);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"1\"sv).takeU8()","uint8_t(1)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_7a8 == true) {
    local_7a8 = false;
    if (local_7c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7c8._M_value + 0x10)) {
      operator_delete((void *)local_7c8._M_value._M_dataplus._M_p,local_7c8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x70,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_780 = false;
  buffer_11._M_str = "1";
  buffer_11._M_len = 1;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_11,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7a0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"1\"sv).takeI8()","uint8_t(1)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_780 == true) {
    local_780 = false;
    if (local_7a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7a0._M_value + 0x10)) {
      operator_delete((void *)local_7a0._M_value._M_dataplus._M_p,local_7a0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x71,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_758 = false;
  buffer_12._M_str = "+1";
  buffer_12._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_12,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_778);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_758 == true) {
    local_758 = false;
    if (local_778._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_778._M_value + 0x10)) {
      operator_delete((void *)local_778._M_value._M_dataplus._M_p,local_778._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"+1\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x73,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_730 = false;
  buffer_13._M_str = "+1";
  buffer_13._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_13,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_750);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"+1\"sv).takeI8()","uint8_t(1)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_730 == true) {
    local_730 = false;
    if (local_750._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_750._M_value + 0x10)) {
      operator_delete((void *)local_750._M_value._M_dataplus._M_p,local_750._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x74,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_708 = false;
  buffer_14._M_str = "-1";
  buffer_14._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_14,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_728);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_708 == true) {
    local_708 = false;
    if (local_728._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_728._M_value + 0x10)) {
      operator_delete((void *)local_728._M_value._M_dataplus._M_p,local_728._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"-1\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x76,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_6e0 = false;
  buffer_15._M_str = "-1";
  buffer_15._M_len = 2;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_15,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_700);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 0xff;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"-1\").takeI8()","uint8_t(-1)",(optional<unsigned_char> *)&local_38,
             (uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_6e0 == true) {
    local_6e0 = false;
    if (local_700._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_700._M_value + 0x10)) {
      operator_delete((void *)local_700._M_value._M_dataplus._M_p,local_700._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_6b8 = false;
  buffer_16._M_str = "0010";
  buffer_16._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_16,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6d8);
  uVar1 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"0010\"sv).takeU8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_38,(uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_6b8 == true) {
    local_6b8 = false;
    if (local_6d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6d8._M_value + 0x10)) {
      operator_delete((void *)local_6d8._M_value._M_dataplus._M_p,local_6d8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x79,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_690 = false;
  buffer_17._M_str = "0010";
  buffer_17._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_17,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6b0);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"0010\"sv).takeI8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_38,(uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_690 == true) {
    local_690 = false;
    if (local_6b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6b0._M_value + 0x10)) {
      operator_delete((void *)local_6b0._M_value._M_dataplus._M_p,local_6b0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_668 = false;
  buffer_18._M_str = "+0010";
  buffer_18._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_18,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_688);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_668 == true) {
    local_668 = false;
    if (local_688._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_688._M_value + 0x10)) {
      operator_delete((void *)local_688._M_value._M_dataplus._M_p,local_688._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"+0010\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7c,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_640 = false;
  buffer_19._M_str = "+0010";
  buffer_19._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_19,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_660);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 10;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"+0010\"sv).takeI8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_38,(uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_640 == true) {
    local_640 = false;
    if (local_660._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_660._M_value + 0x10)) {
      operator_delete((void *)local_660._M_value._M_dataplus._M_p,local_660._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_618 = false;
  buffer_20._M_str = "-0010";
  buffer_20._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_20,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_638);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_618 == true) {
    local_618 = false;
    if (local_638._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_638._M_value + 0x10)) {
      operator_delete((void *)local_638._M_value._M_dataplus._M_p,local_638._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"-0010\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7f,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_5f0 = false;
  buffer_21._M_str = "-0010";
  buffer_21._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_21,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_610);
  uVar1 = ::wasm::WATParser::Lexer::takeI<unsigned_char>();
  local_38._M_value._0_2_ = uVar1;
  local_40.data_._0_1_ = 0xf6;
  testing::internal::CmpHelperEQ<std::optional<unsigned_char>,unsigned_char>
            (local_28,"Lexer(\"-0010\"sv).takeI8()","uint8_t(-10)",
             (optional<unsigned_char> *)&local_38,(uchar *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_5f0 == true) {
    local_5f0 = false;
    if (local_610._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_610._M_value + 0x10)) {
      operator_delete((void *)local_610._M_value._M_dataplus._M_p,local_610._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x80,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_5c8 = false;
  buffer_22._M_str = "9999";
  buffer_22._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_22,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5e8);
  uVar3 = ::wasm::WATParser::Lexer::takeU<unsigned_char>();
  local_28[0] = (internal)((uVar3 >> 8 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_5c8 == true) {
    local_5c8 = false;
    if (local_5e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5e8._M_value + 0x10)) {
      operator_delete((void *)local_5e8._M_value._M_dataplus._M_p,local_5e8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"9999\"sv).takeU8()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x82,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_5a0 = false;
  buffer_23._M_str = "9999";
  buffer_23._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_23,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5c0);
  uVar2 = ::wasm::WATParser::Lexer::takeI<unsigned_short>();
  local_38._M_value._0_4_ = uVar2;
  local_40.data_._0_2_ = 9999;
  testing::internal::CmpHelperEQ<std::optional<unsigned_short>,unsigned_short>
            (local_28,"Lexer(\"9999\"sv).takeI16()","uint16_t(9999)",
             (optional<unsigned_short> *)&local_38,(unsigned_short *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_5a0 == true) {
    local_5a0 = false;
    if (local_5c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5c0._M_value + 0x10)) {
      operator_delete((void *)local_5c0._M_value._M_dataplus._M_p,local_5c0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x83,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_578 = false;
  buffer_24._M_str = "9999";
  buffer_24._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_24,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_598);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_40.data_._0_4_ = 9999;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"9999\"sv).takeU32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_578 == true) {
    local_578 = false;
    if (local_598._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_598._M_value + 0x10)) {
      operator_delete((void *)local_598._M_value._M_dataplus._M_p,local_598._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x84,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_550 = false;
  buffer_25._M_str = "9999";
  buffer_25._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_25,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_570);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_._0_4_ = 9999;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"9999\"sv).takeI32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_550 == true) {
    local_550 = false;
    if (local_570._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_570._M_value + 0x10)) {
      operator_delete((void *)local_570._M_value._M_dataplus._M_p,local_570._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x85,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_528 = false;
  buffer_26._M_str = "+9999";
  buffer_26._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_26,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_548);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 >> 0x20 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_528 == true) {
    local_528 = false;
    if (local_548._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_548._M_value + 0x10)) {
      operator_delete((void *)local_548._M_value._M_dataplus._M_p,local_548._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"+9999\"sv).takeU32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x87,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_500 = false;
  buffer_27._M_str = "+9999";
  buffer_27._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_27,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_520);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_._0_4_ = 9999;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"+9999\"sv).takeI32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_500 == true) {
    local_500 = false;
    if (local_520._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_520._M_value + 0x10)) {
      operator_delete((void *)local_520._M_value._M_dataplus._M_p,local_520._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x88,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_4d8 = false;
  buffer_28._M_str = "-9999";
  buffer_28._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_28,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4f8);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_4d8 == true) {
    local_4d8 = false;
    if (local_4f8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4f8._M_value + 0x10)) {
      operator_delete((void *)local_4f8._M_value._M_dataplus._M_p,local_4f8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"-9999\"sv).takeU32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8a,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_4b0 = false;
  buffer_29._M_str = "-9999";
  buffer_29._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_29,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4d0);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_._0_4_ = 0xffffd8f1;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"-9999\"sv).takeI32()","uint32_t(-9999)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_4b0 == true) {
    local_4b0 = false;
    if (local_4d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4d0._M_value + 0x10)) {
      operator_delete((void *)local_4d0._M_value._M_dataplus._M_p,local_4d0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_488 = false;
  buffer_30._M_str = "12_34";
  buffer_30._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_30,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4a8);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_40.data_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"12_34\"sv).takeU32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_488 == true) {
    local_488 = false;
    if (local_4a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4a8._M_value + 0x10)) {
      operator_delete((void *)local_4a8._M_value._M_dataplus._M_p,local_4a8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_460 = false;
  buffer_31._M_str = "12_34";
  buffer_31._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_31,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_480);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"12_34\"sv).takeI32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_460 == true) {
    local_460 = false;
    if (local_480._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_480._M_value + 0x10)) {
      operator_delete((void *)local_480._M_value._M_dataplus._M_p,local_480._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_438 = false;
  buffer_32._M_str = "1_2_3_4";
  buffer_32._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_32,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_458);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_40.data_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"1_2_3_4\"sv).takeU32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_438 == true) {
    local_438 = false;
    if (local_458._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_458._M_value + 0x10)) {
      operator_delete((void *)local_458._M_value._M_dataplus._M_p,local_458._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x90,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_98._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_410 = false;
  buffer_33._M_str = "1_2_3_4";
  buffer_33._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_33,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_430);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_40.data_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,unsigned_int>
            (local_28,"Lexer(\"1_2_3_4\"sv).takeI32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_38,(uint *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_410 == true) {
    local_410 = false;
    if (local_430._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_430._M_value + 0x10)) {
      operator_delete((void *)local_430._M_value._M_dataplus._M_p,local_430._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x91,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_3e8 = false;
  buffer_34._M_str = "_1234";
  buffer_34._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_34,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_408);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_3e8 == true) {
    local_3e8 = false;
    if (local_408._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_408._M_value + 0x10)) {
      operator_delete((void *)local_408._M_value._M_dataplus._M_p,local_408._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"_1234\"sv).takeU32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x93,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_3c0 = false;
  buffer_35._M_str = "_1234";
  buffer_35._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_35,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3e0);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_3c0 == true) {
    local_3c0 = false;
    if (local_3e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3e0._M_value + 0x10)) {
      operator_delete((void *)local_3e0._M_value._M_dataplus._M_p,local_3e0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"_1234\"sv).takeI32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x94,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_398 = false;
  buffer_36._M_str = "1234_";
  buffer_36._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_36,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3b8);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_398 == true) {
    local_398 = false;
    if (local_3b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3b8._M_value + 0x10)) {
      operator_delete((void *)local_3b8._M_value._M_dataplus._M_p,local_3b8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"1234_\"sv).takeU32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x96,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_370 = false;
  buffer_37._M_str = "1234_";
  buffer_37._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_37,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_390);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_370 == true) {
    local_370 = false;
    if (local_390._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_390._M_value + 0x10)) {
      operator_delete((void *)local_390._M_value._M_dataplus._M_p,local_390._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"1234_\"sv).takeI32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x97,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_348 = false;
  buffer_38._M_str = "12__34";
  buffer_38._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_38,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_368);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_348 == true) {
    local_348 = false;
    if (local_368._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_368._M_value + 0x10)) {
      operator_delete((void *)local_368._M_value._M_dataplus._M_p,local_368._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"12__34\"sv).takeU32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x99,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_320 = false;
  buffer_39._M_str = "12__34";
  buffer_39._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_39,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_340);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_320 == true) {
    local_320 = false;
    if (local_340._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_340._M_value + 0x10)) {
      operator_delete((void *)local_340._M_value._M_dataplus._M_p,local_340._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"12__34\"sv).takeI32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9a,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_2f8 = false;
  buffer_40._M_str = "12cd56";
  buffer_40._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_40,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_318);
  uVar4 = ::wasm::WATParser::Lexer::takeU<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_2f8 == true) {
    local_2f8 = false;
    if (local_318._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_318._M_value + 0x10)) {
      operator_delete((void *)local_318._M_value._M_dataplus._M_p,local_318._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"12cd56\"sv).takeU32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9c,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_2d0 = false;
  buffer_41._M_str = "12cd56";
  buffer_41._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_41,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2f0);
  uVar4 = ::wasm::WATParser::Lexer::takeI<unsigned_int>();
  local_28[0] = (internal)((uVar4 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_2d0 == true) {
    local_2d0 = false;
    if (local_2f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2f0._M_value + 0x10)) {
      operator_delete((void *)local_2f0._M_value._M_dataplus._M_p,local_2f0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,(AssertionResult *)"Lexer(\"12cd56\"sv).takeI32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_2a8 = false;
  buffer_42._M_str = "18446744073709551615";
  buffer_42._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_42,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2c8);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_40.data_ = (AssertHelperData *)0xffffffffffffffff;
  local_30 = extraout_DL_01;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"18446744073709551615\"sv).takeU64()","uint64_t(-1)",
             (optional<unsigned_long> *)&local_38,(unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_2a8 == true) {
    local_2a8 = false;
    if (local_2c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2c8._M_value + 0x10)) {
      operator_delete((void *)local_2c8._M_value._M_dataplus._M_p,local_2c8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_280 = false;
  buffer_43._M_str = "18446744073709551615";
  buffer_43._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_43,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2a0);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_40.data_ = (AssertHelperData *)0xffffffffffffffff;
  local_30 = extraout_DL_02;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"18446744073709551615\"sv).takeI64()","uint64_t(-1)",
             (optional<unsigned_long> *)&local_38,(unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_280 == true) {
    local_280 = false;
    if (local_2a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2a0._M_value + 0x10)) {
      operator_delete((void *)local_2a0._M_value._M_dataplus._M_p,local_2a0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_258 = false;
  buffer_44._M_str = "18446744073709551616";
  buffer_44._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_44,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_278);
  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_03 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_258 == true) {
    local_258 = false;
    if (local_278._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_278._M_value + 0x10)) {
      operator_delete((void *)local_278._M_value._M_dataplus._M_p,local_278._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"18446744073709551616\"sv).takeU64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa3,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_230 = false;
  buffer_45._M_str = "18446744073709551616";
  buffer_45._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_45,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_250);
  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_04 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_230 == true) {
    local_230 = false;
    if (local_250._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_250._M_value + 0x10)) {
      operator_delete((void *)local_250._M_value._M_dataplus._M_p,local_250._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"18446744073709551616\"sv).takeI64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa4,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_208 = false;
  buffer_46._M_str = "+9223372036854775807";
  buffer_46._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_46,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_228);
  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_05 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_208 == true) {
    local_208 = false;
    if (local_228._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_228._M_value + 0x10)) {
      operator_delete((void *)local_228._M_value._M_dataplus._M_p,local_228._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"+9223372036854775807\"sv).takeU64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa6,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_1e0 = false;
  buffer_47._M_str = "+9223372036854775807";
  buffer_47._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_47,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_200);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_40.data_ = (AssertHelperData *)0x7fffffffffffffff;
  local_30 = extraout_DL_06;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,long>
            (local_28,"Lexer(\"+9223372036854775807\"sv).takeI64()","(9223372036854775807L)",
             (optional<unsigned_long> *)&local_38,(long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_1e0 == true) {
    local_1e0 = false;
    if (local_200._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_200._M_value + 0x10)) {
      operator_delete((void *)local_200._M_value._M_dataplus._M_p,local_200._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_1b8 = false;
  buffer_48._M_str = "9223372036854775808";
  buffer_48._M_len = 0x13;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_48,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d8);
  local_38._M_value = ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_40.data_ = (AssertHelperData *)&DAT_8000000000000000;
  local_30 = extraout_DL_07;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"9223372036854775808\"sv).takeU64()",
             "uint64_t((9223372036854775807L)) + 1",(optional<unsigned_long> *)&local_38,
             (unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_1b8 == true) {
    local_1b8 = false;
    if (local_1d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1d8._M_value + 0x10)) {
      operator_delete((void *)local_1d8._M_value._M_dataplus._M_p,local_1d8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_98._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_190 = false;
  buffer_49._M_str = "9223372036854775808";
  buffer_49._M_len = 0x13;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_49,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1b0);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_40.data_ = (AssertHelperData *)&DAT_8000000000000000;
  local_30 = extraout_DL_08;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"9223372036854775808\"sv).takeI64()",
             "uint64_t((9223372036854775807L)) + 1",(optional<unsigned_long> *)&local_38,
             (unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_190 == true) {
    local_190 = false;
    if (local_1b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b0._M_value + 0x10)) {
      operator_delete((void *)local_1b0._M_value._M_dataplus._M_p,local_1b0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xaa,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_168 = false;
  buffer_50._M_str = "+9223372036854775808";
  buffer_50._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_50,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_188);
  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_09 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_168 == true) {
    local_168 = false;
    if (local_188._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_188._M_value + 0x10)) {
      operator_delete((void *)local_188._M_value._M_dataplus._M_p,local_188._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"+9223372036854775808\"sv).takeU64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xac,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_140 = false;
  buffer_51._M_str = "+9223372036854775808";
  buffer_51._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_51,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_160);
  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_10 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_140 == true) {
    local_140 = false;
    if (local_160._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_160._M_value + 0x10)) {
      operator_delete((void *)local_160._M_value._M_dataplus._M_p,local_160._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"+9223372036854775808\"sv).takeI64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xad,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_118 = false;
  buffer_52._M_str = "-9223372036854775808";
  buffer_52._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_52,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_138);
  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_11 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_118 == true) {
    local_118 = false;
    if (local_138._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_138._M_value + 0x10)) {
      operator_delete((void *)local_138._M_value._M_dataplus._M_p,local_138._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"-9223372036854775808\"sv).takeU64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xaf,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_f0 = false;
  buffer_53._M_str = "-9223372036854775808";
  buffer_53._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_53,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_110);
  local_38._M_value = ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_40.data_ = (AssertHelperData *)&DAT_8000000000000000;
  local_30 = extraout_DL_12;
  testing::internal::CmpHelperEQ<std::optional<unsigned_long>,unsigned_long>
            (local_28,"Lexer(\"-9223372036854775808\"sv).takeI64()",
             "uint64_t((-9223372036854775807L-1))",(optional<unsigned_long> *)&local_38,
             (unsigned_long *)&local_40);
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_f0 == true) {
    local_f0 = false;
    if (local_110._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_110._M_value + 0x10)) {
      operator_delete((void *)local_110._M_value._M_dataplus._M_p,local_110._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (gtest_ar._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_c8 = false;
  buffer_54._M_str = "-9223372036854775809";
  buffer_54._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_54,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e8);
  ::wasm::WATParser::Lexer::takeU<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_13 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_c8 == true) {
    local_c8 = false;
    if (local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10)) {
      operator_delete((void *)local_e8._M_value._M_dataplus._M_p,local_e8._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"-9223372036854775809\"sv).takeU64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb2,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10)
       ) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_a0 = false;
  buffer_55._M_str = "-9223372036854775809";
  buffer_55._M_len = 0x14;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_98,buffer_55,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c0);
  ::wasm::WATParser::Lexer::takeI<unsigned_long>();
  local_28[0] = (internal)(~extraout_DL_14 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_58 == true) {
    local_58 = false;
    if (local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10)) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,local_78._16_8_ + 1);
    }
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_,local_88._8_8_ - local_98._8_8_);
  }
  if (local_a0 == true) {
    local_a0 = false;
    if (local_c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c0._M_value + 0x10)) {
      operator_delete((void *)local_c0._M_value._M_dataplus._M_p,local_c0._16_8_ + 1);
    }
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_28,
               (AssertionResult *)"Lexer(\"-9223372036854775809\"sv).takeI64()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb3,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_98._0_8_ != (long)local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    if ((long *)local_38._M_value != (long *)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  return;
}

Assistant:

TEST(LexerTest, LexInt) {
  EXPECT_EQ(Lexer("0"sv).takeU8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI16(), uint16_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU64(), uint64_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI64(), uint64_t(0));

  EXPECT_FALSE(Lexer("+0"sv).takeU8());
  EXPECT_EQ(Lexer("+0"sv).takeI8(), uint8_t(0));

  EXPECT_FALSE(Lexer("-0"sv).takeU8());
  EXPECT_EQ(Lexer("-0"sv).takeI8(), uint8_t(0));

  EXPECT_EQ(Lexer("1"sv).takeU8(), uint8_t(1));
  EXPECT_EQ(Lexer("1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("+1"sv).takeU8());
  EXPECT_EQ(Lexer("+1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("-1"sv).takeU8());
  EXPECT_EQ(Lexer("-1").takeI8(), uint8_t(-1));

  EXPECT_EQ(Lexer("0010"sv).takeU8(), uint8_t(10));
  EXPECT_EQ(Lexer("0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("+0010"sv).takeU8());
  EXPECT_EQ(Lexer("+0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("-0010"sv).takeU8());
  EXPECT_EQ(Lexer("-0010"sv).takeI8(), uint8_t(-10));

  EXPECT_FALSE(Lexer("9999"sv).takeU8());
  EXPECT_EQ(Lexer("9999"sv).takeI16(), uint16_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeU32(), uint32_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("+9999"sv).takeU32());
  EXPECT_EQ(Lexer("+9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("-9999"sv).takeU32());
  EXPECT_EQ(Lexer("-9999"sv).takeI32(), uint32_t(-9999));

  EXPECT_EQ(Lexer("12_34"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("12_34"sv).takeI32(), uint32_t(1234));

  EXPECT_EQ(Lexer("1_2_3_4"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("1_2_3_4"sv).takeI32(), uint32_t(1234));

  EXPECT_FALSE(Lexer("_1234"sv).takeU32());
  EXPECT_FALSE(Lexer("_1234"sv).takeI32());

  EXPECT_FALSE(Lexer("1234_"sv).takeU32());
  EXPECT_FALSE(Lexer("1234_"sv).takeI32());

  EXPECT_FALSE(Lexer("12__34"sv).takeU32());
  EXPECT_FALSE(Lexer("12__34"sv).takeI32());

  EXPECT_FALSE(Lexer("12cd56"sv).takeU32());
  EXPECT_FALSE(Lexer("12cd56"sv).takeI32());

  EXPECT_EQ(Lexer("18446744073709551615"sv).takeU64(), uint64_t(-1));
  EXPECT_EQ(Lexer("18446744073709551615"sv).takeI64(), uint64_t(-1));

  // 64-bit overflow!
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeU64());
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeI64());

  EXPECT_FALSE(Lexer("+9223372036854775807"sv).takeU64());
  EXPECT_EQ(Lexer("+9223372036854775807"sv).takeI64(), INT64_MAX);

  EXPECT_EQ(Lexer("9223372036854775808"sv).takeU64(), uint64_t(INT64_MAX) + 1);
  EXPECT_EQ(Lexer("9223372036854775808"sv).takeI64(), uint64_t(INT64_MAX) + 1);

  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeU64());
  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeI64());

  EXPECT_FALSE(Lexer("-9223372036854775808"sv).takeU64());
  EXPECT_EQ(Lexer("-9223372036854775808"sv).takeI64(), uint64_t(INT64_MIN));

  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeU64());
  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeI64());
}